

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::E_formatter<spdlog::details::scoped_padder>::format
          (E_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  unsigned_long uVar1;
  unsigned_long value;
  long lVar2;
  scoped_padder p;
  scoped_padder local_60;
  format_int local_38;
  
  scoped_padder::scoped_padder(&local_60,10,&(this->super_flag_formatter).padinfo_,dest);
  lVar2 = (msg->time).__d.__r;
  uVar1 = lVar2 / 1000000000;
  value = -uVar1;
  if (0 < (long)uVar1) {
    value = uVar1;
  }
  local_38.str_ = fmt::v7::format_int::format_unsigned<unsigned_long>(&local_38,value);
  if (lVar2 < -999999999) {
    local_38.str_[-1] = '-';
    local_38.str_ = local_38.str_ + -1;
  }
  lVar2 = (long)&local_38 - (long)local_38.str_;
  if (-0x16 < lVar2) {
    fmt::v7::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_38.str_,local_38.str_ + lVar2 + 0x15);
    scoped_padder::~scoped_padder(&local_60);
    return;
  }
  fmt::v7::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/spdlog/spdlog/fmt/bundled/core.h"
             ,0x146,"negative value");
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const size_t field_size = 10;
        ScopedPadder p(field_size, padinfo_, dest);
        auto duration = msg.time.time_since_epoch();
        auto seconds = std::chrono::duration_cast<std::chrono::seconds>(duration).count();
        fmt_helper::append_int(seconds, dest);
    }